

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomsite.cpp
# Opt level: O0

void __thiscall
CIF::AtomSite::applySymmetry
          (AtomSite *this,vector<CIF::Symmetry,_std::allocator<CIF::Symmetry>_> *symmetryvector)

{
  Symmetry symmetry;
  bool bVar1;
  reference __src;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  double dStack_98;
  undefined1 local_90 [8];
  Symmetry s;
  iterator __end1;
  iterator __begin1;
  vector<CIF::Symmetry,_std::allocator<CIF::Symmetry>_> *__range1;
  vector<CIF::Symmetry,_std::allocator<CIF::Symmetry>_> *symmetryvector_local;
  AtomSite *this_local;
  
  __end1 = std::vector<CIF::Symmetry,_std::allocator<CIF::Symmetry>_>::begin(symmetryvector);
  s.zOperation.c =
       (double)std::vector<CIF::Symmetry,_std::allocator<CIF::Symmetry>_>::end(symmetryvector);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<CIF::Symmetry_*,_std::vector<CIF::Symmetry,_std::allocator<CIF::Symmetry>_>_>
                                *)&s.zOperation.c);
    if (!bVar1) break;
    __src = __gnu_cxx::
            __normal_iterator<CIF::Symmetry_*,_std::vector<CIF::Symmetry,_std::allocator<CIF::Symmetry>_>_>
            ::operator*(&__end1);
    memcpy(local_90,__src,0x60);
    memcpy(&local_f0,local_90,0x60);
    symmetry.xOperation.yf = (double)uStack_e8;
    symmetry.xOperation.xf = (double)local_f0;
    symmetry.xOperation.zf = (double)local_e0;
    symmetry.xOperation.c = (double)uStack_d8;
    symmetry.yOperation.xf = (double)local_d0;
    symmetry.yOperation.yf = (double)uStack_c8;
    symmetry.yOperation.zf = (double)local_c0;
    symmetry.yOperation.c = (double)uStack_b8;
    symmetry.zOperation.xf = (double)local_b0;
    symmetry.zOperation.yf = (double)uStack_a8;
    symmetry.zOperation.zf = (double)local_a0;
    symmetry.zOperation.c = dStack_98;
    applySymmetry(this,symmetry);
    __gnu_cxx::
    __normal_iterator<CIF::Symmetry_*,_std::vector<CIF::Symmetry,_std::allocator<CIF::Symmetry>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void AtomSite::applySymmetry(std::vector<Symmetry> symmetryvector) {
        for (Symmetry s : symmetryvector)
            applySymmetry(s);
    }